

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::xpression_linker<char>::
accept<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<false>>
          (xpression_linker<char> *this,
          optional_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
          *matcher,void *next)

{
  iterator *piVar1;
  _Elt_pointer ppvVar2;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar3;
  void *local_18;
  
  ppvVar2 = (this->back_stack_).c.super__Deque_base<const_void_*,_std::allocator<const_void_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_18 = next;
  if (ppvVar2 ==
      (this->back_stack_).c.super__Deque_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<void_const*,std::allocator<void_const*>>::_M_push_back_aux<void_const*const&>
              ((deque<void_const*,std::allocator<void_const*>> *)this,&local_18);
  }
  else {
    *ppvVar2 = next;
    piVar1 = &(this->back_stack_).c.super__Deque_base<const_void_*,_std::allocator<const_void_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pmVar3 = (matcher->xpr_).xpr_.px;
  (*(pmVar3->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable[3])(pmVar3,this);
  return;
}

Assistant:

void accept(optional_matcher<Xpr, Greedy> const &matcher, void const *next)
    {
        this->back_stack_.push(next);
        matcher.xpr_.link(*this);
    }